

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc.c
# Opt level: O2

void sbox_s256_lowmc_full(mzd_local_t *in,word256 mask_a,word256 mask_b,word256 mask_c)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [32];
  undefined1 in_ZMM1 [64];
  undefined1 in_ZMM2 [64];
  undefined1 auVar5 [32];
  
  auVar3 = *(undefined1 (*) [32])in->w64;
  auVar2 = vpand_avx2(auVar3,in_ZMM0._0_32_);
  auVar4 = vpand_avx2(auVar3,in_ZMM1._0_32_);
  auVar1 = vpand_avx2(auVar3,in_ZMM2._0_32_);
  auVar5 = vpsllq_avx2(auVar2,2);
  auVar3 = vpsrlq_avx2(auVar2,0x3e);
  auVar3 = vpermq_avx2(auVar3,0x93);
  auVar2 = vpor_avx2(auVar3,auVar5);
  auVar3 = vpaddq_avx2(auVar4,auVar4);
  auVar4 = vpsrlq_avx2(auVar4,0x3f);
  auVar4 = vpermq_avx2(auVar4,0x93);
  auVar4 = vpor_avx2(auVar4,auVar3);
  auVar3 = vpand_avx2(auVar2,auVar1);
  auVar5 = vpternlogq_avx512vl(auVar3,auVar4,auVar2,0x96);
  auVar3 = vpor_avx2(auVar2,auVar4);
  auVar2 = vpternlogq_avx512vl(auVar2,auVar4,auVar1,0x78);
  auVar4 = vpsrlq_avx2(auVar2,2);
  auVar2 = vpsllq_avx2(auVar2,0x3e);
  auVar2 = vpermq_avx2(auVar2,0x39);
  auVar2 = vpternlogq_avx512vl(auVar2,auVar3,auVar4,0x36);
  auVar4 = vpsrlq_avx2(auVar5,1);
  auVar3 = vpsllq_avx2(auVar5,0x3f);
  auVar3 = vpermq_avx2(auVar3,0x39);
  auVar3 = vpor_avx2(auVar3,auVar4);
  auVar3 = vpternlogq_avx512vl(auVar3,auVar1,auVar2,0x96);
  *(undefined1 (*) [32])in->w64 = auVar3;
  return;
}

Assistant:

ATTR_TARGET_AVX2
static inline void sbox_s256_lowmc_full(mzd_local_t* in, const word256 mask_a, const word256 mask_b,
                                        const word256 mask_c) {
  const word256 min = mm256_load(in);
  // a
  word256 x0m = mm256_and(min, mask_a);
  // b
  word256 x1m = mm256_and(min, mask_b);
  // c
  word256 x2m = mm256_and(min, mask_c);

  x0m = mm256_rotate_left(x0m, 2);
  x1m = mm256_rotate_left(x1m, 1);

  // b & c
  word256 t0 = mm256_and(x1m, x2m);
  // a & c
  word256 t1 = mm256_and(x0m, x2m);
  // a & b
  word256 t2 = mm256_and(x0m, x1m);

  // (b & c) ^ a
  t0 = mm256_xor(t0, x0m);

  // a ^ b
  x0m = mm256_xor(x0m, x1m);
  // a ^ b ^ (a & c)
  t1 = mm256_xor(t1, x0m);
  // a ^ b ^ c ^ (a & b)
  t2 = mm256_xor(mm256_xor(t2, x0m), x2m);

  t0 = mm256_rotate_right(t0, 2);
  t1 = mm256_rotate_right(t1, 1);

  mm256_store(in, mm256_xor(mm256_xor(t0, t1), t2));
}